

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

bool __thiscall Assimp::ASEImporter::GenerateNormals(ASEImporter *this,Mesh *mesh)

{
  float *pfVar1;
  pointer paVar2;
  const_iterator qq;
  pointer paVar3;
  
  paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((paVar3 != paVar2) && (this->configRecomputeNormals == false)) {
    while (paVar3 != paVar2) {
      if (paVar3->x != 0.0) {
        return true;
      }
      if (NAN(paVar3->x)) {
        return true;
      }
      if (paVar3->y != 0.0) {
        return true;
      }
      if (NAN(paVar3->y)) {
        return true;
      }
      pfVar1 = &paVar3->z;
      paVar3 = paVar3 + 1;
      if (*pfVar1 != 0.0) {
        return true;
      }
      if (NAN(*pfVar1)) {
        return true;
      }
    }
  }
  ComputeNormalsWithSmoothingsGroups<Assimp::ASE::Face>
            (&mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  return false;
}

Assistant:

bool ASEImporter::GenerateNormals(ASE::Mesh& mesh)  {

    if (!mesh.mNormals.empty() && !configRecomputeNormals)
    {
        // Check whether there are only uninitialized normals. If there are
        // some, skip all normals from the file and compute them on our own
        for (std::vector<aiVector3D>::const_iterator qq =  mesh.mNormals.begin();qq != mesh.mNormals.end();++qq) {
            if ((*qq).x || (*qq).y || (*qq).z)
            {
                return true;
            }
        }
    }
    // The array is reused.
    ComputeNormalsWithSmoothingsGroups<ASE::Face>(mesh);
    return false;
}